

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  void **arr;
  byte bVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int itemsize;
  int itemsize_00;
  int iVar12;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar13;
  void *__dest;
  long lVar14;
  int res_3;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  int local_88;
  uint local_84;
  uchar *local_80;
  void *local_78;
  ulong local_70;
  ulong local_68;
  uchar *local_60;
  int local_58;
  int local_54;
  ulong local_50;
  int *local_48;
  size_t local_40;
  ulong local_38;
  
  local_80 = (uchar *)0x0;
  local_48 = out_len;
  local_78 = malloc(0x20000);
  local_50 = 5;
  if (5 < quality) {
    local_50 = (ulong)(uint)quality;
  }
  stbiw__sbgrowf(&local_80,1,itemsize);
  iVar12 = *(int *)(local_80 + -4);
  *(int *)(local_80 + -4) = iVar12 + 1;
  local_80[iVar12] = 'x';
  iVar11 = *(int *)(local_80 + -4);
  iVar12 = iVar11 + 1;
  if (*(int *)(local_80 + -8) <= iVar12) {
    stbiw__sbgrowf(&local_80,1,itemsize_00);
    iVar11 = *(int *)(local_80 + -4);
    iVar12 = iVar11 + 1;
  }
  *(int *)(local_80 + -4) = iVar12;
  local_80[iVar11] = '^';
  local_84 = 1;
  local_88 = 1;
  puVar7 = stbiw__zlib_flushf(local_80,&local_84,&local_88);
  local_84 = local_84 | 1 << ((byte)local_88 & 0x1f);
  local_88 = local_88 + 2;
  puVar7 = stbiw__zlib_flushf(puVar7,&local_84,&local_88);
  uVar9 = 0;
  local_80 = puVar7;
  memset(local_78,0,0x20000);
  if (3 < data_len) {
    local_54 = data_len + -3;
    local_58 = (int)local_50 * 2;
    local_38 = local_50 & 0xffffffff;
    local_40 = local_38 * 8;
    uVar17 = 0;
    uVar13 = extraout_RDX;
    local_70 = (ulong)(uint)data_len;
    do {
      iVar12 = (int)uVar13;
      iVar11 = (int)uVar17;
      pbVar1 = data + iVar11;
      uVar9 = (uint)CONCAT12(data[(long)iVar11 + 2],*(undefined2 *)(data + iVar11)) * 8 ^
              (uint)CONCAT12(data[(long)iVar11 + 2],*(undefined2 *)(data + iVar11));
      uVar9 = (uVar9 >> 5) + uVar9;
      uVar9 = uVar9 * 0x10 ^ uVar9;
      uVar9 = (uVar9 >> 0x11) + uVar9;
      uVar15 = (ulong)((uVar9 >> 6) + uVar9 & 0x3fff);
      __dest = *(void **)((long)local_78 + uVar15 * 8);
      local_68 = uVar17;
      local_60 = puVar7;
      if (__dest == (void *)0x0) {
        iVar20 = 3;
        lVar21 = 0;
LAB_00118307:
        arr = (void **)((long)local_78 + uVar15 * 8);
        stbiw__sbgrowf(arr,8,iVar12);
        __dest = *arr;
        iVar11 = *(int *)((long)__dest + -4);
        iVar10 = iVar11 + 1;
      }
      else {
        if ((long)*(int *)((long)__dest + -4) < 1) {
          iVar20 = 3;
          lVar21 = 0;
        }
        else {
          iVar12 = (int)local_70 - iVar11;
          uVar9 = iVar12 - 1;
          if (0x100 < uVar9) {
            uVar9 = 0x101;
          }
          iVar20 = 3;
          lVar14 = 0;
          lVar21 = 0;
          do {
            lVar18 = *(long *)((long)__dest + lVar14 * 8);
            if ((long)(iVar11 + -0x8000) < lVar18 - (long)data) {
              uVar17 = 0;
              if (0 < iVar12) {
                do {
                  if (*(byte *)(lVar18 + uVar17) != pbVar1[uVar17]) goto LAB_001182ac;
                  uVar17 = uVar17 + 1;
                } while (uVar9 + 1 != uVar17);
                uVar17 = (ulong)(uVar9 + 1);
              }
LAB_001182ac:
              iVar16 = (int)uVar17;
              iVar10 = iVar20;
              if (iVar20 < iVar16) {
                iVar10 = iVar16;
              }
              bVar4 = iVar20 <= iVar16;
              iVar20 = iVar10;
              if (bVar4) {
                lVar21 = lVar18;
              }
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != *(int *)((long)__dest + -4));
          if (__dest == (void *)0x0) goto LAB_00118307;
        }
        iVar11 = *(int *)((long)__dest + -4);
        if (iVar11 == local_58) {
          memmove(__dest,(void *)((long)__dest + local_38 * 8),local_40);
          iVar11 = (int)local_50;
          *(int *)((long)__dest + -4) = iVar11;
          iVar12 = extraout_EDX;
        }
        iVar10 = iVar11 + 1;
        if (*(int *)((long)__dest + -8) <= iVar10) goto LAB_00118307;
      }
      *(int *)((long)__dest + -4) = iVar10;
      *(byte **)((long)__dest + (long)iVar11 * 8) = pbVar1;
      data_len = (int)local_70;
      uVar9 = (uint)local_68;
      bVar8 = (byte)local_88;
      if (lVar21 == 0) {
LAB_00118464:
        bVar2 = *pbVar1;
        if (bVar2 < 0x90) {
          uVar5 = bVar2 + 0x30;
          iVar12 = 0;
          iVar11 = -8;
          do {
            iVar12 = (uVar5 & 1) + iVar12 * 2;
            uVar5 = uVar5 >> 1;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
          uVar5 = iVar12 << (bVar8 & 0x1f);
          local_88 = local_88 + 8;
        }
        else {
          uVar5 = bVar2 | 0x100;
          iVar12 = 0;
          iVar11 = -9;
          do {
            iVar12 = (uVar5 & 1) + iVar12 * 2;
            uVar5 = uVar5 >> 1;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
          uVar5 = iVar12 << (bVar8 & 0x1f);
          local_88 = local_88 + 9;
        }
        local_84 = local_84 | uVar5;
        iVar20 = 1;
        puVar7 = local_60;
LAB_00118614:
        puVar7 = stbiw__zlib_flushf(puVar7,&local_84,&local_88);
        uVar13 = extraout_RDX_01;
      }
      else {
        uVar5 = (uint)*(uint3 *)(pbVar1 + 1) * 8 ^ (uint)*(uint3 *)(pbVar1 + 1);
        uVar5 = (uVar5 >> 5) + uVar5;
        uVar5 = uVar5 * 0x10 ^ uVar5;
        uVar5 = (uVar5 >> 0x11) + uVar5;
        lVar14 = *(long *)((long)local_78 + (ulong)((uVar5 >> 6) + uVar5 & 0x3fff) * 8);
        if ((lVar14 != 0) && (0 < (long)*(int *)(lVar14 + -4))) {
          uVar5 = (~uVar9 + data_len) - 1;
          if (0x100 < uVar5) {
            uVar5 = 0x101;
          }
          lVar18 = 0;
          do {
            lVar3 = *(long *)(lVar14 + lVar18 * 8);
            if ((long)(int)(uVar9 - 0x7fff) < lVar3 - (long)data) {
              uVar17 = 0;
              if (0 < (int)(~uVar9 + data_len)) {
                do {
                  if (*(byte *)(lVar3 + uVar17) != pbVar1[uVar17 + 1]) goto LAB_001183ea;
                  uVar17 = uVar17 + 1;
                } while (uVar5 + 1 != uVar17);
                uVar17 = (ulong)(uVar5 + 1);
              }
LAB_001183ea:
              if (iVar20 < (int)uVar17) goto LAB_00118464;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != *(int *)(lVar14 + -4));
        }
        iVar12 = (int)pbVar1 - (int)lVar21;
        if ((0x7fff < iVar12) || (0x102 < iVar20)) {
          __assert_fail("d <= 32767 && best <= 258",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image_write.h"
                        ,0x323,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)"
                       );
        }
        uVar17 = 0;
        do {
          uVar15 = uVar17;
          uVar17 = uVar15 + 1;
        } while ((int)(uint)stbi_zlib_compress::lengthc[uVar15 + 1] <= iVar20);
        if (uVar15 < 0x17) {
          iVar11 = 0;
          iVar10 = -7;
          do {
            iVar11 = ((uint)uVar17 & 1) + iVar11 * 2;
            uVar17 = (ulong)((uint)uVar17 >> 1);
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
          uVar9 = iVar11 << (bVar8 & 0x1f);
          local_88 = local_88 + 7;
        }
        else {
          uVar9 = (int)uVar17 + 0xa8;
          iVar11 = 0;
          iVar10 = -8;
          do {
            iVar11 = (uVar9 & 1) + iVar11 * 2;
            uVar9 = uVar9 >> 1;
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
          uVar9 = iVar11 << (bVar8 & 0x1f);
          local_88 = local_88 + 8;
        }
        local_84 = local_84 | uVar9;
        puVar7 = stbiw__zlib_flushf(local_60,&local_84,&local_88);
        uVar15 = uVar15 & 0xffffffff;
        if (0xffffffffffffffeb < uVar15 - 0x1c) {
          local_84 = local_84 |
                     iVar20 - (uint)stbi_zlib_compress::lengthc[uVar15] << ((byte)local_88 & 0x1f);
          local_88 = (uint)""[uVar15] + local_88;
          puVar7 = stbiw__zlib_flushf(puVar7,&local_84,&local_88);
        }
        data_len = (int)local_70;
        uVar17 = 0xffffffffffffffff;
        uVar9 = (uint)local_68;
        do {
          lVar21 = uVar17 + 2;
          uVar17 = uVar17 + 1;
        } while ((int)(uint)stbi_zlib_compress::distc[lVar21] <= iVar12);
        iVar11 = 0;
        iVar10 = -5;
        uVar15 = uVar17 & 0xffffffff;
        do {
          iVar11 = ((uint)uVar15 & 1) + iVar11 * 2;
          uVar15 = uVar15 >> 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
        local_84 = local_84 | iVar11 << ((byte)local_88 & 0x1f);
        local_88 = local_88 + 5;
        puVar7 = stbiw__zlib_flushf(puVar7,&local_84,&local_88);
        uVar13 = extraout_RDX_00;
        if (3 < uVar17) {
          local_84 = local_84 |
                     iVar12 - (uint)stbi_zlib_compress::distc[uVar17 & 0xffffffff] <<
                     ((byte)local_88 & 0x1f);
          local_88 = (uint)""[uVar17 & 0xffffffff] + local_88;
          goto LAB_00118614;
        }
      }
      uVar9 = iVar20 + uVar9;
      uVar17 = (ulong)uVar9;
    } while ((int)uVar9 < local_54);
  }
  if ((int)uVar9 < data_len) {
    lVar21 = (long)(int)uVar9;
    local_80 = puVar7;
    do {
      bVar8 = data[lVar21];
      if (bVar8 < 0x90) {
        uVar9 = bVar8 + 0x30;
        iVar12 = 0;
        iVar11 = -8;
        do {
          iVar12 = (uVar9 & 1) + iVar12 * 2;
          uVar9 = uVar9 >> 1;
          iVar11 = iVar11 + 1;
        } while (iVar11 != 0);
        uVar9 = iVar12 << ((byte)local_88 & 0x1f);
        local_88 = local_88 + 8;
      }
      else {
        uVar9 = bVar8 | 0x100;
        iVar12 = 0;
        iVar11 = -9;
        do {
          iVar12 = (uVar9 & 1) + iVar12 * 2;
          uVar9 = uVar9 >> 1;
          iVar11 = iVar11 + 1;
        } while (iVar11 != 0);
        uVar9 = iVar12 << ((byte)local_88 & 0x1f);
        local_88 = local_88 + 9;
      }
      local_84 = local_84 | uVar9;
      puVar7 = stbiw__zlib_flushf(puVar7,&local_84,&local_88);
      lVar21 = lVar21 + 1;
    } while ((uint)lVar21 != data_len);
  }
  local_88 = local_88 + 7;
  local_80 = puVar7;
  puVar7 = stbiw__zlib_flushf(puVar7,&local_84,&local_88);
  if (local_88 != 0) {
    do {
      local_88 = local_88 + 1;
      puVar7 = stbiw__zlib_flushf(puVar7,&local_84,&local_88);
    } while (local_88 != 0);
  }
  lVar21 = 0;
  local_80 = puVar7;
  do {
    lVar14 = *(long *)((long)local_78 + lVar21 * 8);
    if (lVar14 != 0) {
      free((void *)(lVar14 + -8));
    }
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x4000);
  free(local_78);
  if (data_len < 1) {
    uVar5 = 0;
    uVar19 = 1;
    uVar9 = extraout_EDX_00;
  }
  else {
    uVar6 = (uint)data_len % 0x15b0;
    uVar19 = 1;
    uVar5 = 0;
    uVar17 = 0;
    do {
      if (uVar6 != 0) {
        uVar15 = 0;
        do {
          uVar19 = uVar19 + data[uVar15 + uVar17];
          uVar5 = uVar5 + uVar19;
          uVar15 = uVar15 + 1;
        } while (uVar6 != uVar15);
        uVar19 = uVar19 % 0xfff1;
        uVar5 = uVar5 % 0xfff1;
      }
      uVar9 = (int)uVar17 + uVar6;
      uVar17 = (ulong)uVar9;
      uVar6 = 0x15b0;
    } while ((int)uVar9 < data_len);
  }
  if (puVar7 != (uchar *)0x0) {
    iVar11 = *(int *)(puVar7 + -4);
    iVar12 = iVar11 + 1;
    if (iVar12 < *(int *)(puVar7 + -8)) goto LAB_001187e7;
  }
  stbiw__sbgrowf(&local_80,1,uVar9);
  iVar11 = *(int *)(local_80 + -4);
  iVar12 = iVar11 + 1;
  puVar7 = local_80;
  uVar9 = extraout_EDX_01;
LAB_001187e7:
  *(int *)(puVar7 + -4) = iVar12;
  puVar7[iVar11] = (uchar)(uVar5 >> 8);
  if (*(int *)(puVar7 + -8) <= *(int *)(puVar7 + -4) + 1) {
    stbiw__sbgrowf(&local_80,1,uVar9);
    uVar9 = extraout_EDX_02;
  }
  iVar12 = *(int *)(local_80 + -4);
  *(int *)(local_80 + -4) = iVar12 + 1;
  local_80[iVar12] = (uchar)uVar5;
  iVar11 = *(int *)(local_80 + -4);
  iVar12 = iVar11 + 1;
  if (*(int *)(local_80 + -8) <= iVar12) {
    stbiw__sbgrowf(&local_80,1,uVar9);
    iVar11 = *(int *)(local_80 + -4);
    iVar12 = iVar11 + 1;
    uVar9 = extraout_EDX_03;
  }
  *(int *)(local_80 + -4) = iVar12;
  local_80[iVar11] = (uchar)(uVar19 >> 8);
  iVar11 = *(int *)(local_80 + -4);
  iVar12 = iVar11 + 1;
  if (*(int *)(local_80 + -8) <= iVar12) {
    stbiw__sbgrowf(&local_80,1,uVar9);
    iVar11 = *(int *)(local_80 + -4);
    iVar12 = iVar11 + 1;
  }
  *(int *)(local_80 + -4) = iVar12;
  local_80[iVar11] = (uchar)uVar19;
  iVar12 = *(int *)(local_80 + -4);
  *local_48 = iVar12;
  puVar7 = (uchar *)memmove(local_80 + -8,local_80,(long)iVar12);
  return puVar7;
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char ***hash_table = (unsigned char***) STBIW_MALLOC(stbiw__ZHASH * sizeof(char**));
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);
   STBIW_FREE(hash_table);

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, STBIW_UCHAR(s2 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s2));
      stbiw__sbpush(out, STBIW_UCHAR(s1 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s1));
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}